

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::TPZManVector
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  undefined1 auVar1 [16];
  TPZManVector<TFad<6,_double>,_3> *pTVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  TFad<6,_double> *pTVar6;
  TPZVec<TPZManVector<TFad<6,_double>,_3>_> *in_RSI;
  TPZManVector<TFad<6,_double>,_3> *in_RDI;
  ulong uVar7;
  TPZManVector<TFad<6,_double>,_3> *unaff_retaddr;
  int64_t i;
  int64_t size;
  TFad<6,_double> *local_98;
  TFad<6,_double> *local_38;
  long local_30;
  TPZManVector<TFad<6,_double>,_3> *copy_00;
  
  copy_00 = in_RDI;
  TPZVec<TPZManVector<TFad<6,_double>,_3>_>::TPZVec
            ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)in_RDI);
  (in_RDI->super_TPZVec<TFad<6,_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_02439238;
  pTVar2 = in_RDI + 3;
  pTVar6 = in_RDI->fExtAlloc;
  do {
    local_38 = pTVar6;
    TPZManVector<TFad<6,_double>,_3>::TPZManVector(in_RDI,(int64_t)local_38);
    pTVar6 = (TFad<6,_double> *)((long)(local_38 + 3) + 0x20);
  } while ((TFad<6,_double> *)((long)(local_38 + 3) + 0x20) != pTVar2->fExtAlloc);
  uVar3 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::NElements(in_RSI);
  if ((long)uVar3 < 4) {
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = in_RDI->fExtAlloc;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = uVar3;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0xe0),0);
    uVar7 = uVar4 + 8;
    if (0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0xe0),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar7);
    *puVar5 = uVar3;
    pTVar6 = (TFad<6,_double> *)(puVar5 + 1);
    if (uVar3 != 0) {
      local_98 = pTVar6;
      do {
        TPZManVector<TFad<6,_double>,_3>::TPZManVector(in_RDI,(int64_t)local_38);
        local_98 = (TFad<6,_double> *)(local_98[3].dx_ + 2);
      } while (local_98 != (TFad<6,_double> *)((long)pTVar6 + uVar3 * 0xe0));
    }
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = pTVar6;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = uVar3;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = uVar3;
  }
  for (local_30 = 0; local_30 < (long)uVar3; local_30 = local_30 + 1) {
    TPZManVector<TFad<6,_double>,_3>::operator=(unaff_retaddr,copy_00);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}